

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.h
# Opt level: O0

Path * __thiscall kj::Path::operator=(Path *this,Path *param_1)

{
  Path *param_1_local;
  Path *this_local;
  
  Array<kj::String>::operator=(&this->parts,&param_1->parts);
  return this;
}

Assistant:

Path& operator=(Path&&) = default;